

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O0

array<dap::Variable> * __thiscall
cmDebugger::cmDebuggerVariables::HandleVariablesRequest
          (array<dap::Variable> *__return_storage_ptr__,cmDebuggerVariables *this)

{
  bool bVar1;
  ulong uVar2;
  iterator iVar3;
  iterator iVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  value_type local_1c8;
  reference local_68;
  cmDebuggerVariableEntry *entry;
  iterator __end2;
  iterator __begin2;
  vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  *__range2;
  undefined1 local_38 [8];
  vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  values;
  cmDebuggerVariables *this_local;
  array<dap::Variable> *variables;
  
  values.
  super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<dap::Variable,_std::allocator<dap::Variable>_>::vector(__return_storage_ptr__);
  bVar1 = std::operator!=(&this->GetKeyValuesFunction,(nullptr_t)0x0);
  if (bVar1) {
    std::
    function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
    ::operator()((vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
                  *)local_38,&this->GetKeyValuesFunction);
    __end2 = std::
             vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
             ::begin((vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
                      *)local_38);
    entry = (cmDebuggerVariableEntry *)
            std::
            vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
            ::end((vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
                   *)local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmDebugger::cmDebuggerVariableEntry_*,_std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_>
                                       *)&entry), bVar1) {
      local_68 = __gnu_cxx::
                 __normal_iterator<cmDebugger::cmDebuggerVariableEntry_*,_std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_>
                 ::operator*(&__end2);
      if ((((this->IgnoreEmptyStringEntries & 1U) == 0) ||
          (bVar1 = std::operator==(&local_68->Type,"string"), !bVar1)) ||
         (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
        local_1c8.evaluateName.val.field_2._M_allocated_capacity = 0;
        local_1c8.evaluateName.val.field_2._8_8_ = 0;
        local_1c8.evaluateName.val._M_dataplus = (_Alloc_hider)0x0;
        local_1c8.evaluateName.val._1_7_ = 0;
        local_1c8.evaluateName.val._M_string_length = 0;
        local_1c8.evaluateName.set = false;
        local_1c8.evaluateName._33_7_ = 0;
        dap::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(&local_1c8.evaluateName);
        local_1c8.indexedVariables.val.val = 0;
        local_1c8.indexedVariables.set = false;
        local_1c8.indexedVariables._9_7_ = 0;
        dap::optional<dap::integer>::optional(&local_1c8.indexedVariables);
        local_1c8.memoryReference.val.field_2._M_allocated_capacity = 0;
        local_1c8.memoryReference.val.field_2._8_8_ = 0;
        local_1c8.memoryReference.val._M_dataplus = (_Alloc_hider)0x0;
        local_1c8.memoryReference.val._1_7_ = 0;
        local_1c8.memoryReference.val._M_string_length = 0;
        local_1c8.memoryReference.set = false;
        local_1c8.memoryReference._33_7_ = 0;
        dap::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(&local_1c8.memoryReference);
        std::__cxx11::string::string((string *)&local_1c8.name,(string *)local_68);
        local_1c8.namedVariables.val.val = 0;
        local_1c8.namedVariables.set = false;
        local_1c8.namedVariables._9_7_ = 0;
        dap::optional<dap::integer>::optional(&local_1c8.namedVariables);
        dap::optional<dap::VariablePresentationHint>::
        optional<dap::VariablePresentationHint_const&,void>
                  (&local_1c8.presentationHint,
                   (VariablePresentationHint *)(anonymous_namespace)::PrivateDataHint);
        this_00 = &local_1c8.type;
        if ((this->SupportsVariableType & 1U) == 0) {
          memset(this_00,0,0x28);
          dap::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional(this_00);
        }
        else {
          dap::optional<std::__cxx11::string>::optional<std::__cxx11::string_const&,void>
                    ((optional<std::__cxx11::string> *)this_00,&local_68->Type);
        }
        std::__cxx11::string::string((string *)&local_1c8.value,(string *)&local_68->Value);
        dap::integer::integer(&local_1c8.variablesReference,0);
        std::vector<dap::Variable,_std::allocator<dap::Variable>_>::push_back
                  (__return_storage_ptr__,&local_1c8);
        dap::Variable::~Variable(&local_1c8);
      }
      __gnu_cxx::
      __normal_iterator<cmDebugger::cmDebuggerVariableEntry_*,_std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
    ::~vector((vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
               *)local_38);
  }
  EnumerateSubVariablesIfAny(this,__return_storage_ptr__);
  if ((this->EnableSorting & 1U) != 0) {
    iVar3 = std::vector<dap::Variable,_std::allocator<dap::Variable>_>::begin
                      (__return_storage_ptr__);
    iVar4 = std::vector<dap::Variable,_std::allocator<dap::Variable>_>::end(__return_storage_ptr__);
    std::
    sort<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>
              (iVar3._M_current,iVar4._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

dap::array<dap::Variable> cmDebuggerVariables::HandleVariablesRequest()
{
  dap::array<dap::Variable> variables;

  if (GetKeyValuesFunction != nullptr) {
    auto values = GetKeyValuesFunction();
    for (auto const& entry : values) {
      if (IgnoreEmptyStringEntries && entry.Type == "string" &&
          entry.Value.empty()) {
        continue;
      }
      variables.push_back(dap::Variable{
        {},
        {},
        {},
        entry.Name,
        {},
        PrivateDataHint,
        SupportsVariableType ? entry.Type : dap::optional<dap::string>(),
        entry.Value,
        0 });
    }
  }

  EnumerateSubVariablesIfAny(variables);

  if (EnableSorting) {
    std::sort(variables.begin(), variables.end(),
              [](dap::Variable const& a, dap::Variable const& b) {
                return a.name < b.name;
              });
  }
  return variables;
}